

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::ContributeGlobalDiagonal
          (TPZDohrSubstruct<std::complex<float>_> *this,
          TPZFMatrix<std::complex<float>_> *StiffnessDiag)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  TPZMatrix<std::complex<float>_> *pTVar3;
  long lVar4;
  pair<int,_int> *ppVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  TPZManVector<std::complex<float>,_10>::Resize(&this->fWeights,(long)this->fNEquations);
  if (this->fNEquations < 1) {
    if (fWeightType == CorrectWeight) goto LAB_014a7ade;
  }
  else {
    lVar8 = 0;
    do {
      pTVar3 = ((this->fStiffness).fRef)->fPointer;
      if (((pTVar3->super_TPZBaseMatrix).fRow <= lVar8) ||
         ((pTVar3->super_TPZBaseMatrix).fCol <= lVar8)) {
        TPZMatrix<std::complex<float>_>::Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (pTVar3,lVar8,lVar8);
      (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar8]._M_value =
           *(_ComplexT *)CONCAT44(extraout_var,iVar6);
      lVar8 = lVar8 + 1;
      iVar6 = this->fNEquations;
    } while (lVar8 < iVar6);
    if (fWeightType == CorrectWeight) {
      if (0 < iVar6) {
        lVar8 = 0;
        do {
          pTVar3 = ((this->fStiffness).fRef)->fPointer;
          if (((pTVar3->super_TPZBaseMatrix).fRow <= lVar8) ||
             ((pTVar3->super_TPZBaseMatrix).fCol <= lVar8)) {
            TPZMatrix<std::complex<float>_>::Error
                      ("TPZMatrix<TVar>::Operator()","Index out of range");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                       ,0x33d);
          }
          iVar6 = (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                            (pTVar3,lVar8,lVar8);
          (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar8]._M_value =
               *(_ComplexT *)CONCAT44(extraout_var_00,iVar6);
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->fNEquations);
      }
LAB_014a7ade:
      if (0 < (this->fCoarseNodes).fNElements) {
        lVar8 = 0;
        do {
          lVar4 = (this->fKCi).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow;
          if ((lVar4 <= lVar8) ||
             ((this->fKCi).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <= lVar8))
          {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (this->fWeights).super_TPZVec<std::complex<float>_>.fStore
          [(this->fCoarseNodes).fStore[lVar8]]._M_value =
               (this->fKCi).fElem[lVar4 * lVar8 + lVar8]._M_value;
          lVar8 = lVar8 + 1;
        } while (lVar8 < (this->fCoarseNodes).fNElements);
      }
      goto LAB_014a7b6c;
    }
    if (0 < iVar6) {
      lVar8 = 0;
      do {
        (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar8]._M_value = 0x3f800000;
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->fNEquations);
    }
  }
  if (0 < (this->fCoarseNodes).fNElements) {
    lVar8 = 0;
    do {
      (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[(this->fCoarseNodes).fStore[lVar8]]
      ._M_value = 0x3f800000;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->fCoarseNodes).fNElements);
  }
LAB_014a7b6c:
  uVar7 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar7) {
    uVar9 = 0;
    do {
      ppVar5 = (this->fGlobalEqs).fStore;
      lVar8 = (long)ppVar5[uVar9].second;
      if (((lVar8 < 0) ||
          ((StiffnessDiag->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar8)
          ) || ((StiffnessDiag->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)
         ) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      _Var1 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[ppVar5[uVar9].first].
              _M_value;
      _Var2 = StiffnessDiag->fElem[lVar8]._M_value;
      StiffnessDiag->fElem[lVar8]._M_value =
           CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
      uVar9 = uVar9 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar9);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeGlobalDiagonal(TPZFMatrix<TVar> &StiffnessDiag) {
	int i;
	fWeights.Resize(fNEquations);
	//fWeights = diag(kci) if u(i) is on coarse or diag(Ki)
	for (i=0;i<fNEquations;i++) {
		fWeights[i] = fStiffness->operator()(i,i);
	}
	if(fWeightType == CorrectWeight)
	{
		for (i=0;i<fNEquations;i++) {
			fWeights[i] = fStiffness->operator()(i,i);
		}
		for (i=0;i<fCoarseNodes.NElements();i++) {
			fWeights[fCoarseNodes[i]] = fKCi(i,i);
		}
	} else {
		for (i=0;i<fNEquations;i++) {
			fWeights[i] = 1.;
		}
		for (i=0;i<fCoarseNodes.NElements();i++) {
			fWeights[fCoarseNodes[i]] = 1.;
		}
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weight used for assembly" << fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		StiffnessDiag(ind.second,0) += fWeights[ind.first];
	}
}